

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::CheckBailOutInjection(IRBuilder *this,OpCode opcode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int iVar4;
  undefined6 in_register_00000032;
  
  iVar4 = (int)CONCAT62(in_register_00000032,opcode);
  if (iVar4 < 0x2c) {
    if (iVar4 - 0x1dU < 2) {
      if (this->seenProfiledBeginSwitch != true) {
LAB_004c04f8:
        this->seenProfiledBeginSwitch = true;
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xe0,"(!seenProfiledBeginSwitch)","!seenProfiledBeginSwitch");
      if (bVar2) {
        *puVar3 = 0;
        goto LAB_004c04f8;
      }
      goto LAB_004c087e;
    }
    if (iVar4 == 0x1b) {
      if (this->seenProfiledBeginSwitch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xe4,"(seenProfiledBeginSwitch)","seenProfiledBeginSwitch");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      this->seenProfiledBeginSwitch = false;
      return;
    }
  }
  else {
    if (iVar4 == 0x2c) {
      if (this->seenLdStackArgPtr == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd8,"(seenLdStackArgPtr)","seenLdStackArgPtr");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      if (this->expectApplyArg == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd9,"(expectApplyArg)","expectApplyArg");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      this->seenLdStackArgPtr = false;
      this->expectApplyArg = false;
      return;
    }
    if (iVar4 == 0xaf) {
      if (this->seenLdStackArgPtr == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd3,"(seenLdStackArgPtr)","seenLdStackArgPtr");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      if (this->expectApplyArg == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xd4,"(!expectApplyArg)","!expectApplyArg");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      this->expectApplyArg = true;
      return;
    }
    if (iVar4 == 0x15b) {
      if (this->seenLdStackArgPtr == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xce,"(!seenLdStackArgPtr)","!seenLdStackArgPtr");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      if (this->expectApplyArg == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0xcf,"(!expectApplyArg)","!expectApplyArg");
        if (!bVar2) goto LAB_004c087e;
        *puVar3 = 0;
      }
      this->seenLdStackArgPtr = true;
      return;
    }
  }
  if (this->seenLdStackArgPtr == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xe9,"(!seenLdStackArgPtr)","!seenLdStackArgPtr");
    if (!bVar2) goto LAB_004c087e;
    *puVar3 = 0;
  }
  if (this->expectApplyArg == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0xea,"(!expectApplyArg)","!expectApplyArg");
    if (!bVar2) {
LAB_004c087e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
IRBuilder::CheckBailOutInjection(Js::OpCode opcode)
{
    // Detect these sequence and disable Bailout injection between them:
    //   LdStackArgPtr
    //   LdArgCnt
    //   ApplyArgs
    // This assumes that LdStackArgPtr, LdArgCnt and ApplyArgs can
    // only be emitted in these sequence. This will need to be modified if it changes.
    //
    // Also insert a single bailout before the beginning of a switch case block for all the case labels.
    switch(opcode)
    {
    case Js::OpCode::LdStackArgPtr:
        Assert(!seenLdStackArgPtr);
        Assert(!expectApplyArg);
        seenLdStackArgPtr = true;
        break;
    case Js::OpCode::LdArgCnt:
        Assert(seenLdStackArgPtr);
        Assert(!expectApplyArg);
        expectApplyArg = true;
        break;
    case Js::OpCode::ApplyArgs:
        Assert(seenLdStackArgPtr);
        Assert(expectApplyArg);
        seenLdStackArgPtr = false;
        expectApplyArg = false;
        break;

    case Js::OpCode::BeginSwitch:
    case Js::OpCode::ProfiledBeginSwitch:
        Assert(!seenProfiledBeginSwitch);
        seenProfiledBeginSwitch = true;
        break;
    case Js::OpCode::EndSwitch:
        Assert(seenProfiledBeginSwitch);
        seenProfiledBeginSwitch = false;
        break;

    default:
        Assert(!seenLdStackArgPtr);
        Assert(!expectApplyArg);
        break;
    }
}